

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmutil.c
# Opt level: O0

PmQueue * Pm_QueueCreate(long num_msgs,int32_t bytes_per_msg)

{
  int iVar1;
  void *pvVar2;
  PmQueueRep *queue;
  int32_t int32s_per_msg;
  int32_t bytes_per_msg_local;
  long num_msgs_local;
  
  iVar1 = (int)((long)bytes_per_msg + 3U >> 2);
  num_msgs_local = (long)pm_alloc(0x40);
  if ((undefined8 *)num_msgs_local == (undefined8 *)0x0) {
    num_msgs_local = 0;
  }
  else {
    *(long *)(num_msgs_local + 0x10) = num_msgs * (iVar1 + 1);
    pvVar2 = pm_alloc(*(long *)(num_msgs_local + 0x10) << 2);
    *(void **)(num_msgs_local + 0x28) = pvVar2;
    memset(*(void **)(num_msgs_local + 0x28),0,*(long *)(num_msgs_local + 0x10) << 2);
    if (*(long *)(num_msgs_local + 0x28) == 0) {
      pm_free((void *)num_msgs_local);
      num_msgs_local = 0;
    }
    else {
      pvVar2 = pm_alloc((long)iVar1 << 2);
      *(void **)(num_msgs_local + 0x30) = pvVar2;
      if (*(long *)(num_msgs_local + 0x30) == 0) {
        pm_free(*(void **)(num_msgs_local + 0x28));
        pm_free((void *)num_msgs_local);
        num_msgs_local = 0;
      }
      else {
        memset(*(void **)(num_msgs_local + 0x28),0,*(long *)(num_msgs_local + 0x10) << 2);
        *(undefined8 *)num_msgs_local = 0;
        *(undefined8 *)(num_msgs_local + 8) = 0;
        *(int *)(num_msgs_local + 0x20) = iVar1 + 1;
        *(undefined8 *)(num_msgs_local + 0x18) = 0;
        *(undefined4 *)(num_msgs_local + 0x24) = 0;
        *(undefined4 *)(num_msgs_local + 0x38) = 0;
      }
    }
  }
  return (PmQueue *)num_msgs_local;
}

Assistant:

PMEXPORT PmQueue *Pm_QueueCreate(long num_msgs, int32_t bytes_per_msg)
{
    int32_t int32s_per_msg = 
            (int32_t) (((bytes_per_msg + sizeof(int32_t) - 1) &
                       ~(sizeof(int32_t) - 1)) / sizeof(int32_t));
    PmQueueRep *queue = (PmQueueRep *) pm_alloc(sizeof(PmQueueRep));
    if (!queue) /* memory allocation failed */
        return NULL;

    /* need extra word per message for non-zero encoding */
    queue->len = num_msgs * (int32s_per_msg + 1);
    queue->buffer = (int32_t *) pm_alloc(queue->len * sizeof(int32_t));
    bzero(queue->buffer, queue->len * sizeof(int32_t));
    if (!queue->buffer) {
        pm_free(queue);
        return NULL;
    } else { /* allocate the "peek" buffer */
        queue->peek = (int32_t *) pm_alloc(int32s_per_msg * sizeof(int32_t));
        if (!queue->peek) {
            /* free everything allocated so far and return */
            pm_free(queue->buffer);
            pm_free(queue);
            return NULL;
        }
    }
    bzero(queue->buffer, queue->len * sizeof(int32_t));
    queue->head = 0;
    queue->tail = 0;
    /* msg_size is in words */
    queue->msg_size = int32s_per_msg + 1; /* note extra word is counted */
    queue->overflow = FALSE;
    queue->peek_overflow = FALSE;
    queue->peek_flag = FALSE;
    return queue;
}